

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_subdiv_mesh.cpp
# Opt level: O3

void __thiscall embree::SubdivMesh::~SubdivMesh(SubdivMesh *this)

{
  size_t *psVar1;
  size_t *psVar2;
  EdgeCreaseMap *pEVar3;
  void *pvVar4;
  VertexCreaseMap *pVVar5;
  pointer pRVar6;
  char *ptr;
  MemoryMonitorInterface *pMVar7;
  HoleSet *pHVar8;
  size_t sVar9;
  uint *puVar10;
  Buffer *pBVar11;
  long *plVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__SubdivMesh_02191418;
  pEVar3 = (this->edgeCreaseMap)._M_t.
           super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>
           .super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl;
  if (pEVar3 != (EdgeCreaseMap *)0x0) {
    pvVar4 = *(void **)&(pEVar3->edgeCreaseMap).vec;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    operator_delete(pEVar3);
  }
  (this->edgeCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::EdgeCreaseMap,_std::default_delete<embree::EdgeCreaseMap>_>._M_t.
  super__Tuple_impl<0UL,_embree::EdgeCreaseMap_*,_std::default_delete<embree::EdgeCreaseMap>_>.
  super__Head_base<0UL,_embree::EdgeCreaseMap_*,_false>._M_head_impl = (EdgeCreaseMap *)0x0;
  pVVar5 = (this->vertexCreaseMap)._M_t.
           super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>
           ._M_t.
           super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>
           .super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl;
  if (pVVar5 != (VertexCreaseMap *)0x0) {
    pvVar4 = *(void **)&(pVVar5->vertexCreaseMap).vec;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    operator_delete(pVVar5);
  }
  (this->vertexCreaseMap)._M_t.
  super___uniq_ptr_impl<embree::VertexCreaseMap,_std::default_delete<embree::VertexCreaseMap>_>._M_t
  .super__Tuple_impl<0UL,_embree::VertexCreaseMap_*,_std::default_delete<embree::VertexCreaseMap>_>.
  super__Head_base<0UL,_embree::VertexCreaseMap_*,_false>._M_head_impl = (VertexCreaseMap *)0x0;
  pRVar6 = (this->patch_eval_trees).
           super__Vector_base<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref,_std::allocator<embree::PatchT<embree::Vec3fa,_embree::Vec3fa>::Ref>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar6 != (pointer)0x0) {
    operator_delete(pRVar6);
  }
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::~vector(&this->vertex_attrib_buffer_tags);
  std::
  vector<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>,_std::allocator<std::vector<embree::SharedLazyTessellationCache::CacheEntry,_std::allocator<embree::SharedLazyTessellationCache::CacheEntry>_>_>_>
  ::~vector(&this->vertex_buffer_tags);
  uVar14 = (this->invalid_face).size_alloced;
  ptr = (this->invalid_face).items;
  if (ptr == (char *)0x0) {
LAB_00d31d5e:
    if (uVar14 == 0) goto LAB_00d31d7a;
  }
  else {
    if (uVar14 < 0x1c00000) {
      alignedFree(ptr);
      goto LAB_00d31d5e;
    }
    os_free(ptr,uVar14,(this->invalid_face).alloc.hugepages);
  }
  pMVar7 = (this->invalid_face).alloc.device;
  (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,-uVar14,1);
LAB_00d31d7a:
  (this->invalid_face).size_active = 0;
  (this->invalid_face).size_alloced = 0;
  (this->invalid_face).items = (char *)0x0;
  pHVar8 = (this->holeSet)._M_t.
           super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>._M_t.
           super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
           super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl;
  if (pHVar8 != (HoleSet *)0x0) {
    pvVar4 = *(void **)&(pHVar8->holeSet).vec;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    operator_delete(pHVar8);
  }
  (this->holeSet)._M_t.super___uniq_ptr_impl<embree::HoleSet,_std::default_delete<embree::HoleSet>_>
  ._M_t.super__Tuple_impl<0UL,_embree::HoleSet_*,_std::default_delete<embree::HoleSet>_>.
  super__Head_base<0UL,_embree::HoleSet_*,_false>._M_head_impl = (HoleSet *)0x0;
  sVar9 = (this->halfEdgeFace).size_alloced;
  puVar10 = (this->halfEdgeFace).items;
  if (puVar10 != (uint *)0x0) {
    if (sVar9 * 4 < 0x1c00000) {
      alignedFree(puVar10);
    }
    else {
      os_free(puVar10,sVar9 * 4,(this->halfEdgeFace).alloc.hugepages);
    }
  }
  if (sVar9 != 0) {
    pMVar7 = (this->halfEdgeFace).alloc.device;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar9 * -4,1);
  }
  (this->halfEdgeFace).size_active = 0;
  (this->halfEdgeFace).size_alloced = 0;
  (this->halfEdgeFace).items = (uint *)0x0;
  sVar9 = (this->faceStartEdge).size_alloced;
  puVar10 = (this->faceStartEdge).items;
  if (puVar10 != (uint *)0x0) {
    if (sVar9 * 4 < 0x1c00000) {
      alignedFree(puVar10);
    }
    else {
      os_free(puVar10,sVar9 * 4,(this->faceStartEdge).alloc.hugepages);
    }
  }
  if (sVar9 != 0) {
    pMVar7 = (this->faceStartEdge).alloc.device;
    (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar9 * -4,1);
  }
  (this->faceStartEdge).size_active = 0;
  (this->faceStartEdge).size_alloced = 0;
  (this->faceStartEdge).items = (uint *)0x0;
  pBVar11 = (this->holes).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar11 = (this->levels).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar11 = (this->vertex_crease_weights).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar11 = (this->vertex_creases).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar11 = (this->edge_crease_weights).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  pBVar11 = (this->edge_creases).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  psVar1 = &(this->vertexAttribs).size_active;
  uVar14 = (this->vertexAttribs).size_active;
  if (uVar14 != 0) {
    lVar15 = 0x30;
    uVar13 = 0;
    do {
      plVar12 = *(long **)((long)&((this->vertexAttribs).items)->ptr_ofs + lVar15);
      if (plVar12 != (long *)0x0) {
        (**(code **)(*plVar12 + 0x18))();
        uVar14 = *psVar1;
      }
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x38;
    } while (uVar13 < uVar14);
  }
  operator_delete((this->vertexAttribs).items);
  psVar2 = &(this->vertices).size_active;
  *psVar1 = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (RawBufferView *)0x0;
  uVar14 = (this->vertices).size_active;
  if (uVar14 != 0) {
    lVar15 = 0x30;
    uVar13 = 0;
    do {
      plVar12 = *(long **)((long)&(((this->vertices).items)->super_RawBufferView).ptr_ofs + lVar15);
      if (plVar12 != (long *)0x0) {
        (**(code **)(*plVar12 + 0x18))();
        uVar14 = *psVar2;
      }
      uVar13 = uVar13 + 1;
      lVar15 = lVar15 + 0x38;
    } while (uVar13 < uVar14);
  }
  operator_delete((this->vertices).items);
  *psVar2 = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fa> *)0x0;
  if ((this->topology).size_active != 0) {
    lVar15 = 0;
    uVar14 = 0;
    do {
      Topology::~Topology((Topology *)((long)&((this->topology).items)->mesh + lVar15));
      uVar14 = uVar14 + 1;
      lVar15 = lVar15 + 0xa0;
    } while (uVar14 < (this->topology).size_active);
  }
  operator_delete((this->topology).items);
  (this->topology).size_active = 0;
  (this->topology).size_alloced = 0;
  (this->topology).items = (Topology *)0x0;
  pBVar11 = (this->faceVertices).super_RawBufferView.buffer.ptr;
  if (pBVar11 != (Buffer *)0x0) {
    (*(pBVar11->super_RefCount)._vptr_RefCount[3])();
  }
  Geometry::~Geometry(&this->super_Geometry);
  return;
}

Assistant:

SubdivMesh::~SubdivMesh() {}